

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::getPossibleTimings
          (MultipleShootingTranscription *this,
          vector<double,_std::allocator<double>_> *stateEvaluations,
          vector<double,_std::allocator<double>_> *controlEvaluations)

{
  bool bVar1;
  size_type sVar2;
  pointer paVar3;
  reference pvVar4;
  vector<double,_std::allocator<double>_> *in_RDX;
  MultipleShootingTranscription *in_RSI;
  long in_RDI;
  iterator mesh;
  MeshPointOrigin ignored;
  MeshPointOrigin first;
  size_t controlIndex;
  size_t stateIndex;
  MultipleShootingTranscription *in_stack_00000958;
  MeshPointOrigin *in_stack_ffffffffffffff08;
  MeshPointOrigin *in_stack_ffffffffffffff10;
  __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
  in_stack_ffffffffffffff28;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  size_type local_30;
  size_type local_28;
  bool local_1;
  
  bVar1 = preliminaryChecks(in_RSI);
  if (bVar1) {
    bVar1 = setMeshPoints(in_stack_00000958);
    if (bVar1) {
      sVar2 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)in_RSI);
      if (sVar2 != *(long *)(in_RDI + 0x48) - 1U) {
        std::vector<double,_std::allocator<double>_>::resize
                  (in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28._M_current);
      }
      sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
      if (sVar2 != *(size_type *)(in_RDI + 0x50)) {
        std::vector<double,_std::allocator<double>_>::resize
                  (in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28._M_current);
      }
      local_28 = 0;
      local_30 = 0;
      MeshPointOrigin::FirstPoint();
      MeshPointOrigin::Ignored();
      std::
      vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>
      ::begin((vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>
               *)in_stack_ffffffffffffff08);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
                                 *)in_stack_ffffffffffffff10,
                                (__normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
                                 *)in_stack_ffffffffffffff08), bVar1) {
        __gnu_cxx::
        __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
        ::operator->((__normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
                      *)&stack0xffffffffffffff28);
        bVar1 = MeshPointOrigin::operator!=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        if (bVar1) {
          paVar3 = __gnu_cxx::
                   __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
                   ::operator->((__normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
                                 *)&stack0xffffffffffffff28);
          in_stack_ffffffffffffff10 = (MeshPointOrigin *)paVar3->time;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)in_RSI,local_28);
          *pvVar4 = (value_type)in_stack_ffffffffffffff10;
          local_28 = local_28 + 1;
        }
        paVar3 = __gnu_cxx::
                 __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
                 ::operator->((__normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
                               *)&stack0xffffffffffffff28);
        if (paVar3->type == Control) {
          paVar3 = __gnu_cxx::
                   __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
                   ::operator->((__normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
                                 *)&stack0xffffffffffffff28);
          in_stack_ffffffffffffff08 = (MeshPointOrigin *)paVar3->time;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,local_30);
          *pvVar4 = (value_type)in_stack_ffffffffffffff08;
          local_30 = local_30 + 1;
        }
        __gnu_cxx::
        __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
        ::operator++((__normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
                      *)&stack0xffffffffffffff28);
      }
      local_1 = true;
      MeshPointOrigin::~MeshPointOrigin(in_stack_ffffffffffffff10);
      MeshPointOrigin::~MeshPointOrigin(in_stack_ffffffffffffff10);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool getPossibleTimings(std::vector<double>& stateEvaluations, std::vector<double>& controlEvaluations) {

                if (!preliminaryChecks()) {
                    return false;
                }

                if (!setMeshPoints()){
                    return false;
                }

                if (stateEvaluations.size() != (m_totalMeshes - 1)) {
                    stateEvaluations.resize(m_totalMeshes - 1);
                }

                if (controlEvaluations.size() != m_controlMeshes) {
                    controlEvaluations.resize(m_controlMeshes);
                }

                size_t stateIndex = 0, controlIndex = 0;

                MeshPointOrigin first = MeshPointOrigin::FirstPoint();
                MeshPointOrigin ignored = MeshPointOrigin::Ignored();

                for (auto mesh = m_meshPoints.begin(); mesh != m_meshPointsEnd; ++mesh){

                    assert(mesh->origin != ignored);

                    if (mesh->origin != first){
                        stateEvaluations[stateIndex] = mesh->time;
                        stateIndex++;
                    }
                    if (mesh->type == MeshPointType::Control){
                        controlEvaluations[controlIndex] = mesh->time;
                        controlIndex++;
                    }
                }

                return true;
            }